

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

double ImGui::ScaleValueFromRatioT<double,double,double>
                 (ImGuiDataType data_type,float t,double v_min,double v_max,bool is_logarithmic,
                 float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  float fVar8;
  long lVar9;
  undefined1 auVar12 [16];
  long lVar10;
  double dVar11;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_register_00001204 [60];
  undefined1 in_register_00001248 [56];
  undefined1 auVar15 [64];
  float fVar16;
  undefined1 auVar17 [16];
  double __x;
  undefined1 in_register_00001288 [56];
  undefined1 auVar18 [64];
  undefined1 in_register_000012c4 [60];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double local_28;
  
  auVar19._4_60_ = in_register_000012c4;
  auVar19._0_4_ = logarithmic_zero_epsilon;
  auVar18._8_56_ = in_register_00001288;
  auVar18._0_8_ = v_max;
  auVar15._8_56_ = in_register_00001248;
  auVar15._0_8_ = v_min;
  auVar13 = auVar15._0_16_;
  if ((v_min == v_max) && (!NAN(v_min) && !NAN(v_max))) {
    return v_min;
  }
  auVar17 = auVar18._0_16_;
  auVar14._8_8_ = in_register_00001204._4_8_;
  if (!is_logarithmic) {
    if ((data_type & 0xfffffffeU) == 8) {
      auVar14._0_8_ = (double)t;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = v_max - v_min;
      auVar13 = vfmadd213sd_fma(auVar14,auVar17,auVar13);
      return auVar13._0_8_;
    }
    if (1.0 <= t) {
      return v_max;
    }
    uVar3 = vcmpsd_avx512f(auVar17,auVar13,1);
    bVar4 = (bool)((byte)uVar3 & 1);
    return (v_max - v_min) * (double)t +
           (double)((ulong)bVar4 * -0x4020000000000000 + (ulong)!bVar4 * 0x3fe0000000000000) + v_min
    ;
  }
  if (t <= 0.0) {
    return v_min;
  }
  if (1.0 <= t) {
    return v_max;
  }
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar12 = vxorps_avx512vl(auVar19._0_16_,auVar2);
  auVar20._8_8_ = 0x7fffffffffffffff;
  auVar20._0_8_ = 0x7fffffffffffffff;
  auVar22._0_8_ = (double)logarithmic_zero_epsilon;
  auVar22._8_8_ = in_register_000012c4._4_8_;
  uVar3 = vcmpsd_avx512f(auVar17,ZEXT416(0) << 0x40,0);
  bVar4 = (bool)((byte)uVar3 & 1);
  bVar6 = v_max < v_min;
  bVar7 = v_min < 0.0;
  auVar14 = vandpd_avx(auVar13,auVar20);
  auVar2 = vandpd_avx(auVar17,auVar20);
  uVar3 = vcmpsd_avx512f(auVar14,auVar22,1);
  bVar5 = (bool)((byte)uVar3 & 1);
  fVar8 = auVar12._0_4_;
  lVar9 = (ulong)bVar5 *
          (long)(double)(float)((uint)bVar7 * (int)fVar8 +
                               (uint)!bVar7 * (int)logarithmic_zero_epsilon) +
          (ulong)!bVar5 * (long)v_min;
  uVar3 = vcmpsd_avx512f(auVar2,auVar22,1);
  bVar5 = (bool)((byte)uVar3 & 1);
  lVar10 = (ulong)bVar5 *
           (long)(double)(float)((uint)(v_max < 0.0) * (int)fVar8 +
                                (uint)(v_max >= 0.0) * (int)logarithmic_zero_epsilon) +
           (ulong)!bVar5 * (long)v_max;
  dVar11 = (double)((ulong)bVar6 * lVar10 + (ulong)!bVar6 * lVar9);
  lVar9 = (ulong)bVar6 * lVar9 + (ulong)!bVar6 * lVar10;
  local_28 = (double)((ulong)bVar7 * ((ulong)bVar4 * (long)(double)fVar8 + (ulong)!bVar4 * lVar9) +
                     (ulong)!bVar7 * lVar9);
  fVar8 = (float)((uint)bVar6 * (int)(1.0 - t) + (uint)!bVar6 * (int)t);
  if (0.0 <= v_min * v_max) {
    if ((v_min < 0.0) || (v_max < 0.0)) {
      __x = dVar11 / local_28;
      fVar8 = 1.0 - fVar8;
    }
    else {
      __x = local_28 / dVar11;
      local_28 = dVar11;
    }
  }
  else {
    auVar13 = vminsd_avx(auVar13,auVar17);
    auVar21._0_4_ = (float)auVar13._0_8_;
    auVar21._4_12_ = auVar13._4_12_;
    auVar13._8_4_ = 0x80000000;
    auVar13._0_8_ = 0x8000000080000000;
    auVar13._12_4_ = 0x80000000;
    auVar13 = vxorps_avx512vl(auVar21,auVar13);
    auVar12._8_4_ = 0x7fffffff;
    auVar12._0_8_ = 0x7fffffff7fffffff;
    auVar12._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx512vl(ZEXT416((uint)((float)v_max - (float)v_min)),auVar12);
    fVar16 = auVar13._0_4_ / auVar14._0_4_;
    fVar1 = fVar16 + zero_deadzone_halfsize;
    if ((fVar16 - zero_deadzone_halfsize <= fVar8) && (fVar8 <= fVar1)) {
      return 0.0;
    }
    if (fVar8 < fVar16) {
      dVar11 = pow(-dVar11 / auVar22._0_8_,(double)(1.0 - fVar8 / (fVar16 - zero_deadzone_halfsize))
                  );
      dVar11 = -dVar11;
      local_28 = auVar22._0_8_;
      goto LAB_00301b77;
    }
    __x = local_28 / auVar22._0_8_;
    fVar8 = (fVar8 - fVar1) / (1.0 - fVar1);
    local_28 = auVar22._0_8_;
  }
  dVar11 = pow(__x,(double)fVar8);
LAB_00301b77:
  return dVar11 * local_28;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return v_min;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_floating_point)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}